

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodePtr __thiscall Parser::ParseDefaultExportClause<false>(Parser *this)

{
  Scanner_t *this_00;
  IdentPtr localName;
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  tokens tVar4;
  undefined4 *puVar5;
  ParseNodeClass *pPVar6;
  ParseNodePtr pPVar7;
  ModuleImportOrExportEntryList *importOrExportEntryList;
  Parser *this_01;
  ushort uVar8;
  undefined1 auStack_68 [8];
  RestorePoint parsedClass;
  
  if ((this->m_token).tk != tkDEFAULT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xb32,"(m_token.tk == tkDEFAULT)","m_token.tk == tkDEFAULT");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00 = &this->m_scan;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  tVar4 = (this->m_token).tk;
  if (tVar4 == tkFUNCTION) {
    uVar8 = 0;
LAB_00cfbf80:
    parsedClass.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
    parsedClass.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
    parsedClass.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
    auStack_68._0_4_ = 0xffffffff;
    auStack_68._4_4_ = 0xffffffff;
    parsedClass.m_ichMinTok = 0xffffffff;
    parsedClass.m_ichMinLine = 0xffffffff;
    parsedClass._20_16_ = (undefined1  [16])0x0;
    parsedClass.m_fHadEol = -1;
    parsedClass._44_4_ = 0xffffffff;
    Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_68);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
    tVar4 = (this->m_token).tk;
    if (tVar4 == tkStar) {
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
      tVar4 = (this->m_token).tk;
    }
    uVar1 = 8;
    if (tVar4 == tkID) {
      uVar1 = 1;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_68);
    pPVar6 = (ParseNodeClass *)ParseFncDeclCheckScope<false>(this,uVar8 | uVar1,true);
  }
  else {
    if (tVar4 == tkID) {
      bVar3 = CheckContextualKeyword(this,(this->wellKnownPropertyPids).async);
      if (bVar3) {
        parsedClass.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
        parsedClass.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
        parsedClass.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
        auStack_68._0_4_ = 0xffffffff;
        auStack_68._4_4_ = 0xffffffff;
        parsedClass.m_ichMinTok = 0xffffffff;
        parsedClass.m_ichMinLine = 0xffffffff;
        parsedClass._20_16_ = (undefined1  [16])0x0;
        parsedClass.m_fHadEol = -1;
        parsedClass._44_4_ = 0xffffffff;
        Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_68);
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
        if ((this->m_token).tk == tkFUNCTION) {
          uVar8 = 0x100;
          goto LAB_00cfbf80;
        }
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_68);
      }
    }
    else if (tVar4 == tkCLASS) {
      parsedClass.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      parsedClass.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      parsedClass.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_68._0_4_ = 0xffffffff;
      auStack_68._4_4_ = 0xffffffff;
      parsedClass.m_ichMinTok = 0xffffffff;
      parsedClass.m_ichMinLine = 0xffffffff;
      parsedClass._20_16_ = (undefined1  [16])0x0;
      parsedClass.m_fHadEol = -1;
      parsedClass._44_4_ = 0xffffffff;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_68);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
      tVar4 = (this->m_token).tk;
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_68);
      pPVar6 = ParseClassDecl<false>
                         (this,(uint)(tVar4 == tkID),(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0);
      goto LAB_00cfc04d;
    }
    pPVar6 = (ParseNodeClass *)0x0;
    this_01 = this;
    pPVar7 = ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                              (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
    if (pPVar7 != (ParseNodePtr)0x0) {
      if (pPVar7->nop == knopComma) {
        Error(this_01,-0x7ff5fc16,L"",L"");
      }
      pPVar6 = (ParseNodeClass *)0x0;
    }
  }
LAB_00cfc04d:
  localName = (this->wellKnownPropertyPids)._default;
  importOrExportEntryList = EnsureModuleLocalExportEntryList(this);
  AddModuleImportOrExportEntry
            (this,importOrExportEntryList,(IdentPtr)0x0,localName,localName,(IdentPtr)0x0,0);
  return &pPVar6->super_ParseNode;
}

Assistant:

ParseNodePtr Parser::ParseDefaultExportClause()
{
    Assert(m_token.tk == tkDEFAULT);

    this->GetScanner()->Scan();
    ParseNodePtr pnode = nullptr;
    ushort flags = fFncNoFlgs;

    switch (m_token.tk)
    {
    case tkCLASS:
    {

        // Before we parse the class itself we need to know if the class has an identifier name.
        // If it does, we'll treat this class as an ordinary class declaration which will bind
        // it to that name. Otherwise the class should parse as a nameless class expression and
        // bind only to the export binding.
        BOOL classHasName = false;
        RestorePoint parsedClass;
        this->GetScanner()->Capture(&parsedClass);
        this->GetScanner()->Scan();

        if (m_token.tk == tkID)
        {
            classHasName = true;
        }

        this->GetScanner()->SeekTo(parsedClass);
        ParseNodeClass * pnodeClass;
        pnode = pnodeClass = ParseClassDecl<buildAST>(classHasName, nullptr, nullptr, nullptr);

        if (buildAST)
        {
            AnalysisAssert(pnode != nullptr);
            Assert(pnode->nop == knopClassDecl);

            pnodeClass->SetIsDefaultModuleExport(true);
        }

        break;
    }
    case tkID:
        // If we parsed an async token, it could either modify the next token (if it is a
        // function token) or it could be an identifier (let async = 0; export default async;).
        // To handle both cases, when we parse an async token we need to keep the parser state
        // and rewind if the next token is not function.
        if (CheckContextualKeyword(wellKnownPropertyPids.async))
        {
            RestorePoint parsedAsync;
            this->GetScanner()->Capture(&parsedAsync);
            this->GetScanner()->Scan();
            if (m_token.tk == tkFUNCTION)
            {
                // Token after async is function, consume the async token and continue to parse the
                // function as an async function.
                flags |= fFncAsync;
                goto LFunction;
            }
            // Token after async is not function, no idea what the async token is supposed to mean
            // so rewind and let the default case handle it.
            this->GetScanner()->SeekTo(parsedAsync);
        }
        goto LDefault;
        break;
    case tkFUNCTION:
    {
    LFunction:
        // We just parsed a function token but we need to figure out if the function
        // has an identifier name or not before we call the helper.
        RestorePoint parsedFunction;
        this->GetScanner()->Capture(&parsedFunction);
        this->GetScanner()->Scan();

        if (m_token.tk == tkStar)
        {
            // If we saw 'function*' that indicates we are going to parse a generator,
            // but doesn't tell us if the generator has an identifier or not.
            // Skip the '*' token for now as it doesn't matter yet.
            this->GetScanner()->Scan();
        }

        // We say that if the function has an identifier name, it is a 'normal' declaration
        // and should create a binding to that identifier as well as one for our default export.
        if (m_token.tk == tkID)
        {
            flags |= fFncDeclaration;
        }
        else
        {
            flags |= fFncNoName;
        }

        // Rewind back to the function token and let the helper handle the parsing.
        this->GetScanner()->SeekTo(parsedFunction);
        pnode = ParseFncDeclCheckScope<buildAST>(flags);

        if (buildAST)
        {
            AnalysisAssert(pnode != nullptr);
            Assert(pnode->nop == knopFncDecl);

            pnode->AsParseNodeFnc()->SetIsDefaultModuleExport(true);
        }
        break;
    }
    default:
    LDefault:
    {
        ParseNodePtr pnodeExpression = ParseExpr<buildAST>();

        // Consider: Can we detect this syntax error earlier?
        if (pnodeExpression && pnodeExpression->nop == knopComma)
        {
            Error(ERRsyntax);
        }

        if (buildAST)
        {
            AnalysisAssert(pnodeExpression != nullptr);

            // Mark this node as the default module export. We need to make sure it is put into the correct
            // module export slot when we emit the node.
            ParseNodeExportDefault * pnodeExportDefault;
            pnode = pnodeExportDefault = CreateNodeForOpT<knopExportDefault>();
            pnode->AsParseNodeExportDefault()->pnodeExpr = pnodeExpression;
        }
        break;
    }
    }

    IdentPtr exportName = wellKnownPropertyPids._default;
    AddModuleImportOrExportEntry(EnsureModuleLocalExportEntryList(), nullptr, exportName, exportName, nullptr);

    return pnode;
}